

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O3

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_mutex> *this,double __x)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  undefined8 uVar2;
  long in_RSI;
  ulong uVar3;
  size_t n_bytes;
  undefined1 *ptr;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  memory_buf_t formatted;
  undefined1 local_128 [256];
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  ptr = local_128;
  (*((this->formatter_)._M_t.
     super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
     super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
     super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[2])();
  if ((this->should_do_colors_ == true) && (*(ulong *)(in_RSI + 0x28) < *(ulong *)(in_RSI + 0x30)))
  {
    details::os::fwrite_bytes(ptr,*(ulong *)(in_RSI + 0x28),this->target_file_);
    uVar3 = (ulong)*(int *)(in_RSI + 0x10);
    if (6 < uVar3) {
      uVar2 = std::__throw_out_of_range_fmt
                        ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar3,7);
      pthread_mutex_unlock(__mutex);
      _Unwind_Resume(uVar2);
    }
    details::os::fwrite_bytes
              ((this->colors_)._M_elems[uVar3]._M_dataplus._M_p,
               (this->colors_)._M_elems[uVar3]._M_string_length,this->target_file_);
    details::os::fwrite_bytes
              (ptr + *(long *)(in_RSI + 0x28),*(long *)(in_RSI + 0x30) - *(long *)(in_RSI + 0x28),
               this->target_file_);
    details::os::fwrite_bytes((this->reset).data_,(this->reset).size_,this->target_file_);
    ptr = ptr + *(long *)(in_RSI + 0x30);
    n_bytes = -*(long *)(in_RSI + 0x30);
  }
  else {
    n_bytes = 0;
  }
  details::os::fwrite_bytes(ptr,n_bytes,this->target_file_);
  fflush((FILE *)this->target_file_);
  pthread_mutex_unlock(__mutex);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg) {
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);
    msg.color_range_start = 0;
    msg.color_range_end = 0;
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start) {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_.at(static_cast<size_t>(msg.level)));
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    } else  // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}